

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O1

void duckdb::Bit::SetBitInternal(bitstring_t *bit_string,idx_t n,idx_t new_value)

{
  byte bVar1;
  char *pcVar2;
  
  if ((bit_string->value).pointer.length < 0xd) {
    pcVar2 = (bit_string->value).pointer.prefix;
  }
  else {
    pcVar2 = (bit_string->value).pointer.ptr;
  }
  bVar1 = '\x01' << (~(byte)n & 7);
  if (new_value != 0) {
    pcVar2[(n >> 3) + 1] = pcVar2[(n >> 3) + 1] | bVar1;
    return;
  }
  pcVar2[(n >> 3) + 1] = pcVar2[(n >> 3) + 1] & ~bVar1;
  return;
}

Assistant:

void Bit::SetBitInternal(bitstring_t &bit_string, idx_t n, idx_t new_value) {
	uint8_t *buf = reinterpret_cast<uint8_t *>(bit_string.GetDataWriteable());

	auto idx = Bit::GetBitIndex(n);
	D_ASSERT(idx < bit_string.GetSize());
	auto shift_byte = UnsafeNumericCast<uint8_t>(1 << (7 - (n % 8)));
	if (new_value == 0) {
		shift_byte = ~shift_byte;
		buf[idx] &= shift_byte;
	} else {
		buf[idx] |= shift_byte;
	}
}